

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucln_cmn.cpp
# Opt level: O2

UBool ucln_lib_cleanup_63(void)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 0x40; lVar1 = lVar1 + 8) {
    if (*(code **)((long)gLibCleanupFunctions + lVar1) != (code *)0x0) {
      (**(code **)((long)gLibCleanupFunctions + lVar1))();
      *(undefined8 *)((long)gLibCleanupFunctions + lVar1) = 0;
    }
  }
  for (lVar1 = 0; lVar1 != 0xb8; lVar1 = lVar1 + 8) {
    if (*(code **)((long)gCommonCleanupFunctions + lVar1) != (code *)0x0) {
      (**(code **)((long)gCommonCleanupFunctions + lVar1))();
      *(undefined8 *)((long)gCommonCleanupFunctions + lVar1) = 0;
    }
  }
  return '\x01';
}

Assistant:

U_CFUNC UBool ucln_lib_cleanup(void) {
    int32_t libType = UCLN_START;
    int32_t commonFunc = UCLN_COMMON_START;

    for (libType++; libType<UCLN_COMMON; libType++) {
        ucln_cleanupOne(static_cast<ECleanupLibraryType>(libType));
    }

    for (commonFunc++; commonFunc<UCLN_COMMON_COUNT; commonFunc++) {
        if (gCommonCleanupFunctions[commonFunc])
        {
            gCommonCleanupFunctions[commonFunc]();
            gCommonCleanupFunctions[commonFunc] = NULL;
        }
    }
#if !UCLN_NO_AUTO_CLEANUP && (defined(UCLN_AUTO_ATEXIT) || defined(UCLN_AUTO_LOCAL))
    ucln_unRegisterAutomaticCleanup();
#endif
    return TRUE;
}